

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  Chunk CVar2;
  Chunk *pCVar3;
  byte in_SIL;
  Bignum *in_RDI;
  Chunk new_carry;
  int i;
  Chunk carry;
  int local_14;
  uint local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < in_RDI->used_bigits_; local_14 = local_14 + 1) {
    pCVar3 = RawBigit(in_RDI,local_14);
    uVar1 = *pCVar3;
    pCVar3 = RawBigit(in_RDI,local_14);
    CVar2 = *pCVar3;
    pCVar3 = RawBigit(in_RDI,local_14);
    *pCVar3 = (CVar2 << (in_SIL & 0x1f)) + local_10 & 0xfffffff;
    local_10 = uVar1 >> (0x1c - in_SIL & 0x1f);
  }
  if (local_10 != 0) {
    pCVar3 = RawBigit(in_RDI,(int)in_RDI->used_bigits_);
    *pCVar3 = local_10;
    in_RDI->used_bigits_ = in_RDI->used_bigits_ + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(const int shift_amount) {
  DOUBLE_CONVERSION_ASSERT(shift_amount < kBigitSize);
  DOUBLE_CONVERSION_ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const Chunk new_carry = RawBigit(i) >> (kBigitSize - shift_amount);
    RawBigit(i) = ((RawBigit(i) << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    RawBigit(used_bigits_) = carry;
    used_bigits_++;
  }
}